

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,double *x,double *buffer_sd,
                 bool as_relative_gain,double *buffer_imputed_x,double *saved_xmedian,
                 size_t *split_ix,double *split_point,double *xmin,double *xmax,
                 GainCriterion criterion,double min_gain,MissingAction missing_action,
                 size_t *cols_use,size_t ncols_use,bool force_cols_use,double *X_row_major,
                 size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr,
                 vector<double,_std::allocator<double>_> *w)

{
  double *pdVar1;
  long in_RCX;
  double in_RDX;
  size_t *unaff_RBP;
  double in_RSI;
  long in_RDI;
  byte in_R9B;
  undefined8 unaff_R14;
  size_t unaff_R15;
  double in_XMM0_Qa;
  double dVar2;
  size_t *unaff_retaddr;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  double *in_stack_00000018;
  double *in_stack_00000020;
  undefined8 *in_stack_00000028;
  undefined8 *in_stack_00000030;
  int in_stack_00000038;
  undefined4 in_stack_0000003c;
  int in_stack_00000040;
  uint in_stack_00000044;
  double *in_stack_00000048;
  size_t *in_stack_00000050;
  undefined1 in_stack_00000058;
  undefined7 in_stack_00000059;
  double *in_stack_00000060;
  double *in_stack_00000068;
  vector<double,_std::allocator<double>_> *in_stack_00000070;
  double *in_stack_00000078;
  vector<double,_std::allocator<double>_> *in_stack_00000088;
  vector<double,_std::allocator<double>_> temp_buffer_1;
  vector<double,_std::allocator<double>_> temp_buffer;
  size_t ix;
  double cnt;
  double xmean;
  double gain;
  size_t st_orig;
  double in_stack_fffffffffffffd98;
  double *in_stack_fffffffffffffda0;
  double *in_stack_fffffffffffffda8;
  allocator_type *in_stack_fffffffffffffdb0;
  double *in_stack_fffffffffffffdb8;
  anon_class_8_1_54a39818 in_stack_fffffffffffffdc0;
  double *in_stack_fffffffffffffdc8;
  size_t *in_stack_fffffffffffffdd0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffde0;
  double *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  GainCriterion in_stack_fffffffffffffe14;
  double *in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  size_t *in_stack_fffffffffffffe30;
  double in_stack_fffffffffffffe38;
  double *in_stack_fffffffffffffe40;
  double *in_stack_fffffffffffffe50;
  size_t *in_stack_fffffffffffffe58;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe60;
  undefined8 local_a8;
  undefined8 local_88;
  undefined8 local_70;
  undefined8 local_48;
  undefined8 local_38;
  undefined2 uVar3;
  
  local_88 = 0.0;
  if ((in_stack_00000038 == 4) || (local_70 = in_XMM0_Qa, in_stack_00000038 == 3)) {
    local_70 = 0.0;
  }
  local_48 = in_RSI;
  if (in_stack_00000040 != 0) {
    local_48 = (double)move_NAs_to_front<double>
                                 (in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8,
                                  (size_t)in_stack_fffffffffffffdc0.x,in_stack_fffffffffffffdb8);
  }
  if ((ulong)local_48 < (ulong)in_RDX) {
    if (local_48 == (double)((long)in_RDX - 1U)) {
      dVar2 = *(double *)(in_RCX + *(long *)(in_RDI + (long)local_48 * 8) * 8);
      pdVar1 = (double *)(in_RCX + *(long *)(in_RDI + (long)in_RDX * 8) * 8);
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
        dVar2 = midpoint_with_reorder<double>(in_stack_fffffffffffffd98,1.11093871894102e-317);
        *in_stack_00000020 = dVar2;
        *in_stack_00000018 = local_48;
        if (1.0 <= local_70) {
          local_38 = 0.0;
        }
        else {
          local_38 = 1.0;
        }
      }
      else {
        local_38 = -INFINITY;
      }
    }
    else {
      std::
      sort<unsigned_long*,eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,double>(unsigned_long*,unsigned_long,unsigned_long,double*,double*,bool,double*,double*,unsigned_long&,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>
                ((unsigned_long *)in_stack_fffffffffffffdb8,
                 (unsigned_long *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdc0);
      uVar3 = (undefined2)((ulong)unaff_R14 >> 0x30);
      dVar2 = *(double *)(in_RCX + *(long *)(in_RDI + (long)local_48 * 8) * 8);
      pdVar1 = (double *)(in_RCX + *(long *)(in_RDI + (long)in_RDX * 8) * 8);
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
        *in_stack_00000028 = *(undefined8 *)(in_RCX + *(long *)(in_RDI + (long)local_48 * 8) * 8);
        *in_stack_00000030 = *(undefined8 *)(in_RCX + *(long *)(in_RDI + (long)in_RDX * 8) * 8);
        if ((in_stack_00000038 == 2) || (in_stack_00000038 == 1)) {
          for (local_a8 = local_48; uVar3 = (undefined2)((ulong)unaff_R14 >> 0x30),
              (ulong)local_a8 <= (ulong)in_RDX; local_a8 = (double)((long)local_a8 + 1)) {
            std::vector<double,_std::allocator<double>_>::operator[]
                      (in_stack_00000088,*(size_type *)(in_RDI + (long)local_a8 * 8));
          }
        }
        if ((in_stack_00000040 == 0x16) && ((ulong)in_RSI < (ulong)local_48)) {
          fill_NAs_with_median<double>
                    (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                     (size_t)in_stack_fffffffffffffe18,
                     (double *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                     in_stack_fffffffffffffe08,in_stack_fffffffffffffe40);
          if (((in_stack_00000038 != 2) || ((in_R9B & 1) == 0)) || (0.0 < local_70)) {
            if ((in_stack_00000038 == 2) || (in_stack_00000038 == 1)) {
              local_88 = find_split_std_gain_weighted<double,std::vector<double,std::allocator<double>>,double>
                                   (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                                    in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                                    in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                                    in_stack_fffffffffffffe14,(double)in_stack_fffffffffffffe08,
                                    in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                                    in_stack_fffffffffffffe60);
            }
            else if (in_stack_00000038 == 4) {
              local_88 = find_split_dens_weighted<double,std::vector<double,std::allocator<double>>,double>
                                   (in_stack_fffffffffffffdc8,(size_t *)in_stack_fffffffffffffdc0.x,
                                    (size_t)in_stack_fffffffffffffdb8,
                                    (size_t)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                                    (size_t *)in_stack_fffffffffffffda0,in_stack_fffffffffffffde0);
            }
            else if (in_stack_00000038 == 3) {
              std::allocator<double>::allocator((allocator<double> *)0x2253e8);
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0.x,
                         (size_type)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
              std::allocator<double>::~allocator((allocator<double> *)0x225414);
              std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x2254c8);
              std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x2254d8);
              local_88 = find_split_full_gain_weighted<double,std::vector<double,std::allocator<double>>,double>
                                   (in_stack_00000018,in_stack_00000010,in_stack_00000008,
                                    unaff_retaddr,unaff_RBP,unaff_R15,SUB21((ushort)uVar3 >> 8,0),
                                    (double *)CONCAT44(in_stack_0000003c,3),
                                    (ulong)in_stack_00000044 << 0x20,in_stack_00000048,
                                    in_stack_00000050,
                                    (size_t *)CONCAT71(in_stack_00000059,in_stack_00000058),
                                    in_stack_00000060,in_stack_00000068,(size_t *)in_stack_00000070,
                                    in_stack_00000078,SUB21(uVar3,0),in_stack_00000088);
              std::vector<double,_std::allocator<double>_>::~vector(in_stack_00000070);
            }
          }
          else {
            local_88 = find_split_rel_gain_weighted<double,std::vector<double,std::allocator<double>>,double>
                                 (in_stack_fffffffffffffdc8,(double)in_stack_fffffffffffffdc0.x,
                                  (size_t *)in_stack_fffffffffffffdb8,
                                  (size_t)in_stack_fffffffffffffdb0,
                                  (size_t)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                                  (size_t *)in_stack_00000088,in_stack_fffffffffffffde0);
          }
        }
        else if ((in_stack_00000038 != 2) || (((in_R9B & 1) == 0 || (0.0 < local_70)))) {
          if ((in_stack_00000038 == 2) || (in_stack_00000038 == 1)) {
            local_88 = find_split_std_gain_weighted<double,std::vector<double,std::allocator<double>>,double>
                                 (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                                  in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                                  in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                                  in_stack_fffffffffffffe14,(double)in_stack_fffffffffffffe08,
                                  in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                                  in_stack_fffffffffffffe60);
          }
          else if (in_stack_00000038 == 4) {
            local_88 = find_split_dens_weighted<double,std::vector<double,std::allocator<double>>,double>
                                 (in_stack_fffffffffffffdc8,(size_t *)in_stack_fffffffffffffdc0.x,
                                  (size_t)in_stack_fffffffffffffdb8,
                                  (size_t)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                                  (size_t *)in_stack_fffffffffffffda0,in_stack_fffffffffffffde0);
          }
          else if (in_stack_00000038 == 3) {
            std::allocator<double>::allocator((allocator<double> *)0x2257bd);
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0.x,
                       (size_type)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
            std::allocator<double>::~allocator((allocator<double> *)0x2257e9);
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x225894);
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x2258a1);
            local_88 = find_split_full_gain_weighted<double,std::vector<double,std::allocator<double>>,double>
                                 (in_stack_00000018,in_stack_00000010,in_stack_00000008,
                                  unaff_retaddr,unaff_RBP,unaff_R15,SUB21((ushort)uVar3 >> 8,0),
                                  (double *)CONCAT44(in_stack_0000003c,3),
                                  CONCAT44(in_stack_00000044,in_stack_00000040),in_stack_00000048,
                                  in_stack_00000050,
                                  (size_t *)CONCAT71(in_stack_00000059,in_stack_00000058),
                                  in_stack_00000060,in_stack_00000068,(size_t *)in_stack_00000070,
                                  in_stack_00000078,SUB21(uVar3,0),in_stack_00000088);
            std::vector<double,_std::allocator<double>_>::~vector(in_stack_00000070);
          }
        }
        else {
          local_88 = find_split_rel_gain_weighted<double,std::vector<double,std::allocator<double>>,double>
                               (in_stack_fffffffffffffdc8,(double)in_stack_fffffffffffffdc0.x,
                                (size_t *)in_stack_fffffffffffffdb8,
                                (size_t)in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8,
                                in_stack_fffffffffffffda0,(size_t *)in_stack_00000088,
                                in_stack_fffffffffffffde0);
        }
        local_38 = local_88;
        if (local_88 <= 0.0) {
          local_38 = 0.0;
        }
      }
      else {
        local_38 = -INFINITY;
      }
    }
  }
  else {
    local_38 = -INFINITY;
  }
  return local_38;
}

Assistant:

double eval_guided_crit_weighted(size_t *restrict ix_arr, size_t st, size_t end, real_t_ *restrict x,
                                 double *restrict buffer_sd, bool as_relative_gain,
                                 double *restrict buffer_imputed_x, double *restrict saved_xmedian,
                                 size_t &split_ix, double &restrict split_point, double &restrict xmin, double &restrict xmax,
                                 GainCriterion criterion, double min_gain, MissingAction missing_action,
                                 size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                                 double *restrict X_row_major, size_t ncols,
                                 double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                                 mapping &restrict w)
{
    size_t st_orig = st;
    double gain = 0;
    if (criterion == DensityCrit || criterion == FullGain) min_gain = 0;

    /* move NAs to the front if there's any, exclude them from calculations */
    if (missing_action != Fail)
        st = move_NAs_to_front(ix_arr, st, end, x);

    if (unlikely(st >= end)) return -HUGE_VAL;
    else if (unlikely(st == (end-1)))
    {
        if (x[ix_arr[st]] == x[ix_arr[end]])
            return -HUGE_VAL;
        split_point = midpoint_with_reorder(x[ix_arr[st]], x[ix_arr[end]]);
        split_ix    = st;
        gain        = 1.;
        if (gain > min_gain)
            return gain;
        else
            return 0.;
    }

    /* sort in ascending order */
    std::sort(ix_arr + st, ix_arr + end + 1, [&x](const size_t a, const size_t b){return x[a] < x[b];});
    if (x[ix_arr[st]] == x[ix_arr[end]]) return -HUGE_VAL;
    xmin = x[ix_arr[st]]; xmax = x[ix_arr[end]];

    /* unlike the previous case for the extended model, the data here has not been centered,
       which could make the standard deviations have poor precision. It's nevertheless not
       necessary for this mean to have good precision, since it's only meant for centering,
       so it can be calculated inexactly with simd instructions. */
    real_t_ xmean = 0;
    real_t_ cnt = 0;
    if (criterion == Pooled || criterion == Averaged)
    {
        for (size_t ix = st; ix <= end; ix++)
        {
            xmean += x[ix_arr[ix]];
            cnt += w[ix_arr[ix]];
        }
        xmean /= cnt;
    }

    if (missing_action == Impute && st > st_orig)
    {
        missing_action = Fail;
        fill_NAs_with_median(ix_arr, st_orig, st, end, x, buffer_imputed_x, saved_xmedian);
        if (criterion == Pooled && as_relative_gain && min_gain <= 0)
            gain = find_split_rel_gain_weighted<double, mapping, ldouble_safe>(buffer_imputed_x, (double)xmean, ix_arr, st_orig, end, split_point, split_ix, w);
        else if (criterion == Pooled || criterion == Averaged)
            gain = find_split_std_gain_weighted<double, mapping, ldouble_safe>(buffer_imputed_x, (double)xmean, ix_arr, st_orig, end, buffer_sd, criterion, min_gain, split_point, split_ix, w);
        else if (criterion == DensityCrit)
            gain = find_split_dens_weighted<double, mapping, ldouble_safe>(buffer_imputed_x, ix_arr, st_orig, end, split_point, split_ix, w);
        else if (criterion == FullGain)
        {
            std::vector<double> temp_buffer(mult2(ncols));
            gain = find_split_full_gain_weighted<double, mapping, ldouble_safe>(
                                                 buffer_imputed_x, st_orig, end, ix_arr,
                                                 cols_use, ncols_use, force_cols_use,
                                                 X_row_major, ncols,
                                                 Xr, Xr_ind, Xr_indptr,
                                                 temp_buffer.data(), temp_buffer.data() + ncols,
                                                 split_ix, split_point, true,
                                                 w);
        }
    }

    else
    {
        if (criterion == Pooled && as_relative_gain && min_gain <= 0)
            gain = find_split_rel_gain_weighted<real_t_, mapping, ldouble_safe>(x, xmean, ix_arr, st, end, split_point, split_ix, w);
        else if (criterion == Pooled || criterion == Averaged)
            gain = find_split_std_gain_weighted<real_t_, mapping, ldouble_safe>(x, xmean, ix_arr, st, end, buffer_sd, criterion, min_gain, split_point, split_ix, w);
        else if (criterion == DensityCrit)
            gain = find_split_dens_weighted<real_t_, mapping, ldouble_safe>(x, ix_arr, st, end, split_point, split_ix, w);
        else if (criterion == FullGain)
        {
            std::vector<double> temp_buffer(mult2(ncols));
            gain = find_split_full_gain_weighted<real_t_, mapping, ldouble_safe>(
                                                 x, st, end, ix_arr,
                                                 cols_use, ncols_use, force_cols_use,
                                                 X_row_major, ncols,
                                                 Xr, Xr_ind, Xr_indptr,
                                                 temp_buffer.data(), temp_buffer.data() + ncols,
                                                 split_ix, split_point, true,
                                                 w);
        }
    }

    /* Note: a gain of -Inf signals that the data is unsplittable. Zero signals it's below the minimum. */
    return std::fmax(0., gain);
}